

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b575::CpuTest_state_opcode_returns_instruction_Test::TestBody
          (CpuTest_state_opcode_returns_instruction_Test *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_a8;
  AssertionResult gtest_ar_;
  AssertHelper local_90;
  CpuState next_state;
  optional<n_e_s::core::Opcode> opcode;
  CpuState state;
  undefined8 *puVar2;
  
  (this->super_CpuTest).registers.pc = 0x1234;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'\b');
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&next_state,0x1235);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&state,
             &(this->super_CpuTest).mmu.super_MockMmu,(Matcher<unsigned_short> *)&next_state);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
            ((MockSpec<unsigned_char_(unsigned_short)> *)&state,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
             ,0x38,"mmu","read_byte(0x1235)");
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             ((long)&state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>.
                     _M_payload.super__Optional_payload_base<n_e_s::core::Opcode>._M_payload + 8));
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&next_state);
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x01');
  iVar1 = (*(((this->super_CpuTest).cpu._M_t.
              super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>
              ._M_t.
              super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
              .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu).
            _vptr_ICpu[4])();
  puVar2 = (undefined8 *)CONCAT44(extraout_var,iVar1);
  state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._0_8_ = *puVar2;
  state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ = puVar2[1];
  state._16_8_ = puVar2[2];
  state.start_cycle = puVar2[3];
  state.cycle = puVar2[4];
  opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._0_8_ = *puVar2;
  opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ = puVar2[1];
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&next_state,"0u","state.start_cycle",(uint *)&gtest_ar_,&state.start_cycle)
  ;
  if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
      super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._M_value.family._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
        super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)next_state.current_opcode.
                         super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                         super__Optional_payload_base<n_e_s::core::Opcode>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x3e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&next_state.current_opcode.
                           super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Opcode>._M_payload + 8));
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0x12;
  testing::internal::CmpHelperEQ<int,unsigned_short>
            ((internal *)&next_state,"0x1234","state.start_pc",(int *)&gtest_ar_,&state.start_pc);
  if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
      super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._M_value.family._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
        super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)next_state.current_opcode.
                         super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                         super__Optional_payload_base<n_e_s::core::Opcode>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x3f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&next_state.current_opcode.
                           super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Opcode>._M_payload + 8));
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&next_state,"1u","state.cycle",(uint *)&gtest_ar_,&state.cycle);
  if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
      super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._M_value.family._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
        super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)next_state.current_opcode.
                         super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                         super__Optional_payload_base<n_e_s::core::Opcode>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x40,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&next_state.current_opcode.
                           super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Opcode>._M_payload + 8));
  gtest_ar_.success_ =
       opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
       super__Optional_payload_base<n_e_s::core::Opcode>._M_engaged;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
      super__Optional_payload_base<n_e_s::core::Opcode>._M_engaged == false) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&next_state,(internal *)&gtest_ar_,(AssertionResult *)0x1e528a,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x42,(char *)next_state.current_opcode.
                             super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                             super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._0_8_);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&next_state);
    if ((long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  testing::internal::CmpHelperEQ<n_e_s::core::Instruction,n_e_s::core::Instruction>
            ((internal *)&next_state,"Instruction::PhpImplied","opcode->instruction",
             &gtest_ar_.success_,
             &opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
              super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._M_value.instruction);
  if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
      super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._M_value.family._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
        super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)next_state.current_opcode.
                         super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                         super__Optional_payload_base<n_e_s::core::Opcode>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&next_state.current_opcode.
                           super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Opcode>._M_payload + 8));
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<n_e_s::core::Family,n_e_s::core::Family>
            ((internal *)&next_state,"Family::PHP","opcode->family",(Family *)&gtest_ar_,
             (Family *)&opcode);
  if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
      super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._M_value.family._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
        super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)next_state.current_opcode.
                         super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                         super__Optional_payload_base<n_e_s::core::Opcode>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&next_state.current_opcode.
                           super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Opcode>._M_payload + 8));
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<n_e_s::core::AddressMode,n_e_s::core::AddressMode>
            ((internal *)&next_state,"AddressMode::Implied","opcode->address_mode",
             (AddressMode *)&gtest_ar_,
             &opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
              super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._M_value.address_mode);
  if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
      super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._M_value.family._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
        super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)next_state.current_opcode.
                         super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                         super__Optional_payload_base<n_e_s::core::Opcode>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&next_state.current_opcode.
                           super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Opcode>._M_payload + 8));
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x01');
  iVar1 = (*(((this->super_CpuTest).cpu._M_t.
              super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>
              ._M_t.
              super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
              .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu).
            _vptr_ICpu[4])();
  puVar2 = (undefined8 *)CONCAT44(extraout_var_00,iVar1);
  next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._0_8_ = *puVar2;
  next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ = puVar2[1];
  next_state._16_8_ = puVar2[2];
  next_state.start_cycle = puVar2[3];
  next_state.cycle = puVar2[4];
  local_a8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"0u","next_state.start_cycle",(uint *)&local_a8,
             &next_state.start_cycle);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_a8.data_._0_4_ = 0x1234;
  testing::internal::CmpHelperEQ<int,unsigned_short>
            ((internal *)&gtest_ar_,"0x1234","next_state.start_pc",(int *)&local_a8,
             &next_state.start_pc);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_a8.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"2u","next_state.cycle",(uint *)&local_a8,&next_state.cycle);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x4c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(CpuTest, state_opcode_returns_instruction) {
    registers.pc = 0x1234;
    stage_instruction(PHP);
    // Dummy read
    EXPECT_CALL(mmu, read_byte(0x1235));
    step_execution(1);

    const CpuState state = cpu->state();
    const auto opcode = state.current_opcode;

    EXPECT_EQ(0u, state.start_cycle);
    EXPECT_EQ(0x1234, state.start_pc);
    EXPECT_EQ(1u, state.cycle);

    EXPECT_TRUE(opcode.has_value());
    EXPECT_EQ(Instruction::PhpImplied, opcode->instruction);
    EXPECT_EQ(Family::PHP, opcode->family);
    EXPECT_EQ(AddressMode::Implied, opcode->address_mode);

    // Only cycle should change
    step_execution(1);
    const CpuState next_state = cpu->state();
    EXPECT_EQ(0u, next_state.start_cycle);
    EXPECT_EQ(0x1234, next_state.start_pc);
    EXPECT_EQ(2u, next_state.cycle);
}